

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O1

void CB_EXPLORE_ADF::predict_or_learn_first<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  example *peVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,0);
  peVar1 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = (long)(peVar1->pred).scalars._end - (long)(peVar1->pred).scalars._begin >> 3;
  if (data->tau == 0) {
    if (1 < (uVar2 & 0xffffffff)) {
      lVar4 = 0;
      do {
        (peVar1->pred).scalars._begin[lVar4 * 2 + 3] = 0.0;
        lVar4 = lVar4 + 1;
      } while ((uVar2 & 0xffffffff) - 1 != lVar4);
    }
    ((peVar1->pred).a_s._begin)->score = 1.0;
  }
  else {
    if ((uVar2 & 0xffffffff) != 0) {
      uVar3 = 0;
      do {
        (peVar1->pred).a_s._begin[uVar3].score = 1.0 / (float)(uVar2 & 0xffffffff);
        uVar3 = uVar3 + 1;
      } while ((uVar2 & 0xffffffff) != uVar3);
    }
    data->tau = data->tau - 1;
  }
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>(data->epsilon,1);
  return;
}

Assistant:

void predict_or_learn_first(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Explore tau times, then act according to optimal.
  if (is_learn && data.gen_cs.known_cost.probability < 1 && test_adf_sequence(examples) != nullptr)
    multiline_learn_or_predict<true>(base, examples, data.offset);
  else
    multiline_learn_or_predict<true>(base, examples, data.offset);

  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)preds.size();

  if (data.tau)
  {
    float prob = 1.f / (float)num_actions;
    for (size_t i = 0; i < num_actions; i++) preds[i].score = prob;
    data.tau--;
  }
  else
  {
    for (size_t i = 1; i < num_actions; i++) preds[i].score = 0.;
    preds[0].score = 1.0;
  }

  enforce_minimum_probability(data.epsilon, true, begin_scores(preds), end_scores(preds));
}